

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6aa98::DepsLogTestDoubleEntry::Run(DepsLogTestDoubleEntry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  LoadStatus LVar6;
  Node *pNVar7;
  int unaff_EBP;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  DepsLog log;
  stat st;
  State state;
  
  State::State(&state);
  pTVar2 = g_current_test;
  paVar1 = &log.file_path_.field_2;
  log.needs_recompaction_ = false;
  log.file_ = (FILE *)0x0;
  log.file_path_._M_string_length = 0;
  log.file_path_.field_2._M_local_buf[0] = '\0';
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  err._M_string_length = 0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  log.file_path_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
  bVar3 = DepsLog::OpenForWrite(&log,(string *)&st,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x85,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&st);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x86,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
    goto LAB_001530dc;
  }
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  path.len_ = 5;
  path.str_ = "foo.h";
  st.st_dev = (__dev_t)State::GetNode(&state,path,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
  path_00.len_ = 5;
  path_00.str_ = "bar.h";
  st.st_dev = (__dev_t)State::GetNode(&state,path_00,0);
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
  path_01.len_ = 5;
  path_01.str_ = "out.o";
  pNVar7 = State::GetNode(&state,path_01,0);
  DepsLog::RecordDeps(&log,pNVar7,1,&deps);
  DepsLog::Close(&log);
  pTVar2 = g_current_test;
  iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar5 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x8f,"0 == stat(kTestFilename, &st)");
  iVar5 = (int)st.st_size;
  if (bVar3) {
    bVar4 = testing::Test::Check
                      (g_current_test,0 < (int)st.st_size,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x91,"file_size > 0");
    bVar3 = true;
    unaff_EBP = iVar5;
    if (!bVar4) goto LAB_001530c2;
  }
  else {
LAB_001530c2:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar3 = false;
  }
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
LAB_001530dc:
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log);
  State::~State(&state);
  if (bVar3) {
    State::State(&state);
    pTVar2 = g_current_test;
    log.needs_recompaction_ = false;
    log.file_ = (FILE *)0x0;
    log.file_path_._M_string_length = 0;
    log.file_path_.field_2._M_local_buf[0] = '\0';
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    err._M_string_length = 0;
    log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    err.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    log.file_path_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
    LVar6 = DepsLog::Load(&log,(string *)&st,&state,&err);
    testing::Test::Check
              (pTVar2,LVar6 != LOAD_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
               ,0x99,"log.Load(kTestFilename, &state, &err)");
    std::__cxx11::string::~string((string *)&st);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st,"DepsLogTest-tempfile",(allocator<char> *)&deps);
    bVar3 = DepsLog::OpenForWrite(&log,(string *)&st,&err);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
               ,0x9b,"log.OpenForWrite(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&st);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&err);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x9c,"\"\" == err");
    if (bVar3) {
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path_02.len_ = 5;
      path_02.str_ = "foo.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_02,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_03.len_ = 5;
      path_03.str_ = "bar.h";
      st.st_dev = (__dev_t)State::GetNode(&state,path_03,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,(Node **)&st);
      path_04.len_ = 5;
      path_04.str_ = "out.o";
      pNVar7 = State::GetNode(&state,path_04,0);
      DepsLog::RecordDeps(&log,pNVar7,1,&deps);
      DepsLog::Close(&log);
      pTVar2 = g_current_test;
      iVar5 = stat("DepsLogTest-tempfile",(stat *)&st);
      bVar3 = testing::Test::Check
                        (pTVar2,iVar5 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0xa5,"0 == stat(kTestFilename, &st)");
      if ((!bVar3) ||
         (bVar3 = testing::Test::Check
                            (g_current_test,unaff_EBP == (int)st.st_size,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                             ,0xa7,"file_size == file_size_2"), !bVar3)) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&err);
    DepsLog::~DepsLog(&log);
    State::~State(&state);
    return;
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, DoubleEntry) {
  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and read the same deps.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_2 = (int)st.st_size;
    ASSERT_EQ(file_size, file_size_2);
  }
}